

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_ram_list_entities_for_policy.cc
# Opt level: O2

int __thiscall
aliyun::Ram::ListEntitiesForPolicy
          (Ram *this,RamListEntitiesForPolicyRequestType *req,
          RamListEntitiesForPolicyResponseType *response,RamErrorInfo *error_info)

{
  bool bVar1;
  int iVar2;
  ArrayIndex AVar3;
  AliRpcRequest *this_00;
  Value *pVVar4;
  Value *pVVar5;
  Value *pVVar6;
  char *pcVar7;
  uint uVar8;
  allocator<char> local_40c;
  allocator<char> local_40b;
  allocator<char> local_40a;
  allocator<char> local_409;
  Value val;
  undefined1 local_3e8 [32];
  _Alloc_hider local_3c8;
  size_type local_3c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  _Alloc_hider local_3a8;
  size_type local_3a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  _Alloc_hider local_388;
  size_type local_380;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378;
  _Alloc_hider local_368;
  size_type local_360;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358;
  vector<aliyun::RamListEntitiesForPolicyUserType,_std::allocator<aliyun::RamListEntitiesForPolicyUserType>_>
  *local_348;
  string str_response;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string secheme;
  Reader reader;
  
  str_response._M_dataplus._M_p = (pointer)&str_response.field_2;
  str_response._M_string_length = 0;
  str_response.field_2._M_local_buf[0] = '\0';
  pcVar7 = "http";
  if (this->use_tls_ != false) {
    pcVar7 = "https";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&secheme,pcVar7,(allocator<char> *)&reader);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->version_,(allocator<char> *)local_3e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->appid_,(allocator<char> *)&local_320);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,this->secret_,(allocator<char> *)&val);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 &secheme,"://");
  std::operator+(&local_1e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 this->host_);
  AliRpcRequest::AliRpcRequest(this_00,&local_180,&local_1a0,&local_1c0,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&reader);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_180);
  if (((this->use_tls_ == false) && (pcVar7 = this->proxy_host_, pcVar7 != (char *)0x0)) &&
     (*pcVar7 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,pcVar7,(allocator<char> *)&reader);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
  }
  Json::Value::Value(&val,nullValue);
  Json::Reader::Reader(&reader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"Action",(allocator<char> *)local_3e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"ListEntitiesForPolicy",(allocator<char> *)&local_320);
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_220,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  if ((req->policy_type)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,"PolicyType",(allocator<char> *)local_3e8);
    std::__cxx11::string::string((string *)&local_280,(string *)req);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_260,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_260);
  }
  if ((req->policy_name)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,"PolicyName",(allocator<char> *)local_3e8);
    std::__cxx11::string::string((string *)&local_2c0,(string *)&req->policy_name);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2a0,&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2a0);
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e0,"RegionId",(allocator<char> *)local_3e8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_300,this->region_id_,(allocator<char> *)&local_320);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2e0,&local_300);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_2e0);
  }
  iVar2 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar2 == 0) {
    iVar2 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&str_response);
    if (((0 < iVar2) && (str_response._M_string_length != 0)) &&
       (bVar1 = Json::Reader::parse(&reader,&str_response,&val,true), bVar1)) {
      if (error_info != (RamErrorInfo *)0x0 && iVar2 != 200) {
        bVar1 = Json::Value::isMember(&val,"RequestId");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"RequestId");
          Json::Value::asString_abi_cxx11_((string *)local_3e8,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_3e8,anon_var_dwarf_1e8fc1 + 9,&local_409);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)local_3e8);
        std::__cxx11::string::~string((string *)local_3e8);
        bVar1 = Json::Value::isMember(&val,"Code");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Code");
          Json::Value::asString_abi_cxx11_((string *)local_3e8,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_3e8,anon_var_dwarf_1e8fc1 + 9,&local_40a);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)local_3e8);
        std::__cxx11::string::~string((string *)local_3e8);
        bVar1 = Json::Value::isMember(&val,"HostId");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"HostId");
          Json::Value::asString_abi_cxx11_((string *)local_3e8,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_3e8,anon_var_dwarf_1e8fc1 + 9,&local_40b);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)local_3e8);
        std::__cxx11::string::~string((string *)local_3e8);
        bVar1 = Json::Value::isMember(&val,"Message");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Message");
          Json::Value::asString_abi_cxx11_((string *)local_3e8,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_3e8,anon_var_dwarf_1e8fc1 + 9,&local_40c);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)local_3e8);
        std::__cxx11::string::~string((string *)local_3e8);
      }
      if (response != (RamListEntitiesForPolicyResponseType *)0x0 && iVar2 == 200) {
        bVar1 = Json::Value::isMember(&val,"Groups");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Groups");
          bVar1 = Json::Value::isMember(pVVar4,"Group");
          if (bVar1) {
            pVVar4 = Json::Value::operator[](&val,"Groups");
            pVVar4 = Json::Value::operator[](pVVar4,"Group");
            bVar1 = Json::Value::isArray(pVVar4);
            if (bVar1) {
              for (uVar8 = 0; AVar3 = Json::Value::size(pVVar4), uVar8 < AVar3; uVar8 = uVar8 + 1) {
                local_3e8._0_8_ = local_3e8 + 0x10;
                local_3e8._8_8_ = 0;
                local_3e8[0x10] = '\0';
                local_3c8._M_p = (pointer)&local_3b8;
                local_3c0 = 0;
                local_3b8._M_local_buf[0] = '\0';
                local_3a8._M_p = (pointer)&local_398;
                local_3a0 = 0;
                local_398._M_local_buf[0] = '\0';
                pVVar5 = Json::Value::operator[](pVVar4,uVar8);
                bVar1 = Json::Value::isMember(pVVar5,"GroupName");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"GroupName");
                  Json::Value::asString_abi_cxx11_(&local_320,pVVar6);
                  std::__cxx11::string::operator=((string *)local_3e8,(string *)&local_320);
                  std::__cxx11::string::~string((string *)&local_320);
                }
                bVar1 = Json::Value::isMember(pVVar5,"Comments");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"Comments");
                  Json::Value::asString_abi_cxx11_(&local_320,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_3c8,(string *)&local_320);
                  std::__cxx11::string::~string((string *)&local_320);
                }
                bVar1 = Json::Value::isMember(pVVar5,"AttachDate");
                if (bVar1) {
                  pVVar5 = Json::Value::operator[](pVVar5,"AttachDate");
                  Json::Value::asString_abi_cxx11_(&local_320,pVVar5);
                  std::__cxx11::string::operator=((string *)&local_3a8,(string *)&local_320);
                  std::__cxx11::string::~string((string *)&local_320);
                }
                std::
                vector<aliyun::RamListEntitiesForPolicyGroupType,_std::allocator<aliyun::RamListEntitiesForPolicyGroupType>_>
                ::push_back(&response->groups,(value_type *)local_3e8);
                RamListEntitiesForPolicyGroupType::~RamListEntitiesForPolicyGroupType
                          ((RamListEntitiesForPolicyGroupType *)local_3e8);
              }
            }
          }
        }
        bVar1 = Json::Value::isMember(&val,"Users");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Users");
          bVar1 = Json::Value::isMember(pVVar4,"User");
          if (bVar1) {
            pVVar4 = Json::Value::operator[](&val,"Users");
            pVVar4 = Json::Value::operator[](pVVar4,"User");
            bVar1 = Json::Value::isArray(pVVar4);
            if (bVar1) {
              local_348 = &response->users;
              for (uVar8 = 0; AVar3 = Json::Value::size(pVVar4), uVar8 < AVar3; uVar8 = uVar8 + 1) {
                local_3e8._0_8_ = local_3e8 + 0x10;
                local_3e8._8_8_ = 0;
                local_3e8[0x10] = '\0';
                local_3c8._M_p = (pointer)&local_3b8;
                local_3c0 = 0;
                local_3b8._M_local_buf[0] = '\0';
                local_3a8._M_p = (pointer)&local_398;
                local_3a0 = 0;
                local_398._M_local_buf[0] = '\0';
                local_388._M_p = (pointer)&local_378;
                local_380 = 0;
                local_378._M_local_buf[0] = '\0';
                pVVar5 = Json::Value::operator[](pVVar4,uVar8);
                bVar1 = Json::Value::isMember(pVVar5,"UserId");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"UserId");
                  Json::Value::asString_abi_cxx11_(&local_320,pVVar6);
                  std::__cxx11::string::operator=((string *)local_3e8,(string *)&local_320);
                  std::__cxx11::string::~string((string *)&local_320);
                }
                bVar1 = Json::Value::isMember(pVVar5,"UserName");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"UserName");
                  Json::Value::asString_abi_cxx11_(&local_320,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_3c8,(string *)&local_320);
                  std::__cxx11::string::~string((string *)&local_320);
                }
                bVar1 = Json::Value::isMember(pVVar5,"DisplayName");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"DisplayName");
                  Json::Value::asString_abi_cxx11_(&local_320,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_3a8,(string *)&local_320);
                  std::__cxx11::string::~string((string *)&local_320);
                }
                bVar1 = Json::Value::isMember(pVVar5,"AttachDate");
                if (bVar1) {
                  pVVar5 = Json::Value::operator[](pVVar5,"AttachDate");
                  Json::Value::asString_abi_cxx11_(&local_320,pVVar5);
                  std::__cxx11::string::operator=((string *)&local_388,(string *)&local_320);
                  std::__cxx11::string::~string((string *)&local_320);
                }
                std::
                vector<aliyun::RamListEntitiesForPolicyUserType,_std::allocator<aliyun::RamListEntitiesForPolicyUserType>_>
                ::push_back(local_348,(value_type *)local_3e8);
                RamListEntitiesForPolicyUserType::~RamListEntitiesForPolicyUserType
                          ((RamListEntitiesForPolicyUserType *)local_3e8);
              }
            }
          }
        }
        bVar1 = Json::Value::isMember(&val,"Roles");
        iVar2 = 200;
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Roles");
          bVar1 = Json::Value::isMember(pVVar4,"Role");
          if (bVar1) {
            pVVar4 = Json::Value::operator[](&val,"Roles");
            pVVar4 = Json::Value::operator[](pVVar4,"Role");
            bVar1 = Json::Value::isArray(pVVar4);
            if (bVar1) {
              for (uVar8 = 0; AVar3 = Json::Value::size(pVVar4), uVar8 < AVar3; uVar8 = uVar8 + 1) {
                local_3e8._0_8_ = local_3e8 + 0x10;
                local_3e8._8_8_ = 0;
                local_3e8[0x10] = '\0';
                local_3c8._M_p = (pointer)&local_3b8;
                local_3c0 = 0;
                local_3b8._M_local_buf[0] = '\0';
                local_3a8._M_p = (pointer)&local_398;
                local_3a0 = 0;
                local_398._M_local_buf[0] = '\0';
                local_388._M_p = (pointer)&local_378;
                local_380 = 0;
                local_378._M_local_buf[0] = '\0';
                local_368._M_p = (pointer)&local_358;
                local_360 = 0;
                local_358._M_local_buf[0] = '\0';
                pVVar5 = Json::Value::operator[](pVVar4,uVar8);
                bVar1 = Json::Value::isMember(pVVar5,"RoleId");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"RoleId");
                  Json::Value::asString_abi_cxx11_(&local_320,pVVar6);
                  std::__cxx11::string::operator=((string *)local_3e8,(string *)&local_320);
                  std::__cxx11::string::~string((string *)&local_320);
                }
                bVar1 = Json::Value::isMember(pVVar5,"RoleName");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"RoleName");
                  Json::Value::asString_abi_cxx11_(&local_320,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_3c8,(string *)&local_320);
                  std::__cxx11::string::~string((string *)&local_320);
                }
                bVar1 = Json::Value::isMember(pVVar5,"Arn");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"Arn");
                  Json::Value::asString_abi_cxx11_(&local_320,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_3a8,(string *)&local_320);
                  std::__cxx11::string::~string((string *)&local_320);
                }
                bVar1 = Json::Value::isMember(pVVar5,"Description");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"Description");
                  Json::Value::asString_abi_cxx11_(&local_320,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_388,(string *)&local_320);
                  std::__cxx11::string::~string((string *)&local_320);
                }
                bVar1 = Json::Value::isMember(pVVar5,"AttachDate");
                if (bVar1) {
                  pVVar5 = Json::Value::operator[](pVVar5,"AttachDate");
                  Json::Value::asString_abi_cxx11_(&local_320,pVVar5);
                  std::__cxx11::string::operator=((string *)&local_368,(string *)&local_320);
                  std::__cxx11::string::~string((string *)&local_320);
                }
                std::
                vector<aliyun::RamListEntitiesForPolicyRoleType,_std::allocator<aliyun::RamListEntitiesForPolicyRoleType>_>
                ::push_back(&response->roles,(value_type *)local_3e8);
                RamListEntitiesForPolicyRoleType::~RamListEntitiesForPolicyRoleType
                          ((RamListEntitiesForPolicyRoleType *)local_3e8);
              }
            }
          }
        }
      }
      goto LAB_00145780;
    }
  }
  iVar2 = -1;
  if (error_info != (RamErrorInfo *)0x0) {
    std::__cxx11::string::assign((char *)&error_info->code);
  }
LAB_00145780:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  Json::Reader::~Reader(&reader);
  Json::Value::~Value(&val);
  std::__cxx11::string::~string((string *)&secheme);
  std::__cxx11::string::~string((string *)&str_response);
  return iVar2;
}

Assistant:

int Ram::ListEntitiesForPolicy(const RamListEntitiesForPolicyRequestType& req,
                      RamListEntitiesForPolicyResponseType* response,
                       RamErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","ListEntitiesForPolicy");
  if(!req.policy_type.empty()) {
    req_rpc->AddRequestQuery("PolicyType", req.policy_type);
  }
  if(!req.policy_name.empty()) {
    req_rpc->AddRequestQuery("PolicyName", req.policy_name);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}